

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

json_t * parse_value(lex_t *lex,size_t flags,json_error_t *error)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  json_t *json;
  void *pvVar3;
  json_t *pjVar4;
  char *value;
  char *pcVar5;
  char *pcVar6;
  ulong __size;
  char *pcVar7;
  ulong uVar8;
  
  uVar2 = lex->depth + 1;
  lex->depth = uVar2;
  if (0x800 < uVar2) {
    pcVar5 = "maximum parsing depth reached";
LAB_001066ce:
    error_set(error,lex,pcVar5);
    return (json_t *)0x0;
  }
  iVar1 = lex->token;
  switch(iVar1) {
  case 0x100:
    pcVar5 = (lex->value).string.val;
    uVar2 = (lex->value).string.len;
    if ((uVar2 < 7) || (iVar1 = bcmp(pcVar5,"::MEM::",7), iVar1 != 0)) {
      if (((flags & 0x10) == 0) && (pvVar3 = memchr(pcVar5,0,uVar2), pvVar3 != (void *)0x0)) {
        pcVar5 = "\\u0000 is not allowed without JSON_ALLOW_NUL";
        goto LAB_001066ce;
      }
      json = jsonp_stringn_nocheck_own(pcVar5,uVar2);
      if (json != (json_t *)0x0) {
        (lex->value).string.val = (char *)0x0;
        (lex->value).string.len = 0;
        goto LAB_0010697a;
      }
    }
    else {
      __size = uVar2 - 7 >> 1;
      value = (char *)malloc(__size);
      if (value != (char *)0x0) {
        pcVar7 = value;
        for (pcVar6 = pcVar5 + 7; pcVar6 < pcVar5 + uVar2; pcVar6 = pcVar6 + uVar8) {
          if (pcVar6 + 0x20 < pcVar5 + uVar2) {
            __isoc99_sscanf(pcVar6,
                            "%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx"
                            ,pcVar7,pcVar7 + 1,pcVar7 + 2,pcVar7 + 3,pcVar7 + 4,pcVar7 + 5,
                            pcVar7 + 6,pcVar7 + 7,pcVar7 + 8,pcVar7 + 9,pcVar7 + 10,pcVar7 + 0xb,
                            pcVar7 + 0xc,pcVar7 + 0xd,pcVar7 + 0xe,pcVar7 + 0xf,pcVar7 + 0x10,
                            pcVar7 + 0x11,pcVar7 + 0x12,pcVar7 + 0x13,pcVar7 + 0x14,pcVar7 + 0x15,
                            pcVar7 + 0x16,pcVar7 + 0x17,pcVar7 + 0x18,pcVar7 + 0x19,pcVar7 + 0x1a,
                            pcVar7 + 0x1b,pcVar7 + 0x1c,pcVar7 + 0x1d,pcVar7 + 0x1e,pcVar7 + 0x1f);
            uVar8 = 0x40;
          }
          else {
            __isoc99_sscanf(pcVar6,"%02hhx",pcVar7);
            uVar8 = 2;
          }
          pcVar7 = pcVar7 + (uVar8 >> 1);
        }
        json = json_mem_own(value,__size);
        break;
      }
    }
    goto LAB_00106c98;
  case 0x101:
    json = json_integer((lex->value).integer);
    break;
  case 0x102:
    json = json_real((lex->value).real);
    break;
  case 0x103:
    json = json_true();
    break;
  case 0x104:
    json = json_false();
    break;
  case 0x105:
    json = json_null();
    break;
  default:
    if (iVar1 == -1) {
      pcVar5 = "invalid token";
      goto LAB_001066ce;
    }
    if (iVar1 == 0x5b) {
      json = json_array();
      if (json != (json_t *)0x0) {
        lex_scan(lex,error);
        iVar1 = lex->token;
        if (iVar1 == 0x5d) goto LAB_0010697a;
        while (iVar1 != 0) {
          pjVar4 = parse_value(lex,flags,error);
          if (pjVar4 == (json_t *)0x0) goto LAB_00106c90;
          if (pjVar4->refcount != 0xffffffffffffffff) {
            pjVar4->refcount = pjVar4->refcount + 1;
          }
          iVar1 = json_array_append_new(json,pjVar4);
          json_decref(pjVar4);
          if (iVar1 != 0) goto LAB_00106c90;
          lex_scan(lex,error);
          if (lex->token != 0x2c) {
            if (lex->token == 0x5d) goto LAB_00106971;
            break;
          }
          lex_scan(lex,error);
          iVar1 = lex->token;
        }
        pcVar5 = "\']\' expected";
LAB_00106c83:
        error_set(error,lex,pcVar5);
LAB_00106c90:
        json_decref(json);
      }
      goto LAB_00106c98;
    }
    if (iVar1 != 0x7b) {
      pcVar5 = "unexpected token";
      goto LAB_001066ce;
    }
    json = json_object();
    if (json == (json_t *)0x0) goto LAB_00106c98;
    lex_scan(lex,error);
    iVar1 = lex->token;
    if (iVar1 != 0x7d) {
      while (iVar1 == 0x100) {
        pcVar5 = (lex->value).string.val;
        __n = (lex->value).string.len;
        (lex->value).string.val = (char *)0x0;
        (lex->value).string.len = 0;
        if (pcVar5 == (char *)0x0) goto LAB_00106c98;
        pvVar3 = memchr(pcVar5,0,__n);
        if (pvVar3 != (void *)0x0) {
          jsonp_free(pcVar5);
          pcVar5 = "NUL byte in object key not supported";
          goto LAB_00106c83;
        }
        if (((flags & 1) != 0) && (pjVar4 = json_object_get(json,pcVar5), pjVar4 != (json_t *)0x0))
        {
          jsonp_free(pcVar5);
          pcVar5 = "duplicate object key";
          goto LAB_00106c83;
        }
        lex_scan(lex,error);
        if (lex->token != 0x3a) {
          jsonp_free(pcVar5);
          pcVar5 = "\':\' expected";
          goto LAB_00106c83;
        }
        lex_scan(lex,error);
        pjVar4 = parse_value(lex,flags,error);
        if (pjVar4 == (json_t *)0x0) {
          jsonp_free(pcVar5);
          goto LAB_00106c90;
        }
        if (pjVar4->refcount != 0xffffffffffffffff) {
          pjVar4->refcount = pjVar4->refcount + 1;
        }
        iVar1 = json_object_set_new_nocheck(json,pcVar5,pjVar4);
        if (iVar1 != 0) {
          jsonp_free(pcVar5);
          json_decref(pjVar4);
          goto LAB_00106c90;
        }
        json_decref(pjVar4);
        jsonp_free(pcVar5);
        lex_scan(lex,error);
        if (lex->token != 0x2c) {
          if (lex->token == 0x7d) goto LAB_00106971;
          pcVar5 = "\'}\' expected";
          goto LAB_00106c83;
        }
        lex_scan(lex,error);
        iVar1 = lex->token;
      }
      pcVar5 = "string or \'}\' expected";
      goto LAB_00106c83;
    }
    goto LAB_0010697a;
  }
LAB_00106971:
  if (json == (json_t *)0x0) {
LAB_00106c98:
    json = (json_t *)0x0;
  }
  else {
LAB_0010697a:
    lex->depth = lex->depth - 1;
  }
  return json;
}

Assistant:

static json_t *parse_value(lex_t *lex, size_t flags, json_error_t *error)
{
	json_t *json;

	lex->depth++;
	if (lex->depth > JSON_PARSER_MAX_DEPTH) {
		error_set(error, lex, "maximum parsing depth reached");
		return NULL;
	}

	switch (lex->token) {
	case TOKEN_STRING: {
		const char *value = lex->value.string.val;
		size_t len = lex->value.string.len;
		unsigned char * temp, *mem;
		const char *pos;

		if (len >= MEM_TOKEN_LEN && !memcmp(value, MEM_TOKEN, MEM_TOKEN_LEN))
		{
			len = len - MEM_TOKEN_LEN;
			value = value + MEM_TOKEN_LEN;
			mem = temp = malloc(len / 2);
			if (!temp)
				return NULL;

			size_t num_read;
			for (pos = value; pos < value + len; pos += num_read, temp += num_read / 2)
			{
				if (pos + 0x20 < value + len)
				{
					sscanf(pos, 
						"%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx"
						"%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx",
						temp, temp + 1, temp + 2, temp + 3, temp + 4, temp + 5, temp + 6, temp + 7,
						temp + 8, temp + 9, temp + 10, temp + 11, temp + 12, temp + 13, temp + 14, temp + 15,
						temp + 16, temp + 17, temp + 18, temp + 19, temp + 20, temp + 21, temp + 22, temp + 23,
						temp + 24, temp + 25, temp + 26, temp + 27, temp + 28, temp + 29, temp + 30, temp + 31);
					num_read = 0x40;
				}
				else
				{
					sscanf(pos, "%02hhx", temp);
					num_read = 2;
				}
			}
			json = json_mem_own(mem, len / 2);
		}
		else
		{

			if (!(flags & JSON_ALLOW_NUL)) {
				if (memchr(value, '\0', len)) {
					error_set(error, lex, "\\u0000 is not allowed without JSON_ALLOW_NUL");
					return NULL;
				}
			}

			json = jsonp_stringn_nocheck_own(value, len);
			if (json) {
				lex->value.string.val = NULL;
				lex->value.string.len = 0;
			}
		}
		break;
	}

	case TOKEN_INTEGER: {
		json = json_integer(lex->value.integer);
		break;
	}

	case TOKEN_REAL: {
		json = json_real(lex->value.real);
		break;
	}

	case TOKEN_TRUE:
		json = json_true();
		break;

	case TOKEN_FALSE:
		json = json_false();
		break;

	case TOKEN_NULL:
		json = json_null();
		break;

	case '{':
		json = parse_object(lex, flags, error);
		break;

	case '[':
		json = parse_array(lex, flags, error);
		break;

	case TOKEN_INVALID:
		error_set(error, lex, "invalid token");
		return NULL;

	default:
		error_set(error, lex, "unexpected token");
		return NULL;
	}

	if (!json)
		return NULL;

	lex->depth--;
	return json;
}